

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf-c.cc
# Opt level: O0

qpdf_oh qpdf_oh_new_array(qpdf_data qpdf)

{
  qpdf_data qpdf_00;
  qpdf_oh qVar1;
  QPDFObjectHandle local_20;
  qpdf_data local_10;
  qpdf_data qpdf_local;
  
  local_10 = qpdf;
  QTC::TC("qpdf","qpdf-c called qpdf_oh_new_array",0);
  qpdf_00 = local_10;
  QPDFObjectHandle::newArray();
  qVar1 = new_object(qpdf_00,&local_20);
  QPDFObjectHandle::~QPDFObjectHandle(&local_20);
  return qVar1;
}

Assistant:

qpdf_oh
qpdf_oh_new_array(qpdf_data qpdf)
{
    QTC::TC("qpdf", "qpdf-c called qpdf_oh_new_array");
    return new_object(qpdf, QPDFObjectHandle::newArray());
}